

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

connectdata * find_oldest_idle_connection_in_bundle(Curl_easy *data,connectbundle *bundle)

{
  Curl_easy *pCVar1;
  time_t tVar2;
  connectdata *pcVar3;
  long lVar4;
  Curl_easy *pCVar5;
  timeval newer;
  
  newer = curlx_tvnow();
  pcVar3 = data->easy_conn;
  if (pcVar3 == (connectdata *)0x0) {
    pCVar5 = (Curl_easy *)0x0;
  }
  else {
    lVar4 = -1;
    pCVar5 = (Curl_easy *)0x0;
    do {
      pCVar1 = pcVar3->data;
      if ((*(_Bool *)&(pCVar1->msg).list.next == false) &&
         (tVar2 = curlx_tvdiff(newer,*(timeval *)&(pCVar1->set).httpauth), lVar4 < tVar2)) {
        lVar4 = tVar2;
        pCVar5 = pCVar1;
      }
      pcVar3 = (connectdata *)(pcVar3->bundle_node).prev;
    } while (pcVar3 != (connectdata *)0x0);
  }
  return (connectdata *)pCVar5;
}

Assistant:

static struct connectdata *
find_oldest_idle_connection_in_bundle(struct Curl_easy *data,
                                      struct connectbundle *bundle)
{
  struct curl_llist_element *curr;
  time_t highscore=-1;
  time_t score;
  struct timeval now;
  struct connectdata *conn_candidate = NULL;
  struct connectdata *conn;

  (void)data;

  now = Curl_tvnow();

  curr = bundle->conn_list.head;
  while(curr) {
    conn = curr->ptr;

    if(!conn->inuse) {
      /* Set higher score for the age passed since the connection was used */
      score = Curl_tvdiff(now, conn->now);

      if(score > highscore) {
        highscore = score;
        conn_candidate = conn;
      }
    }
    curr = curr->next;
  }

  return conn_candidate;
}